

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_asm.c
# Opt level: O3

void emit_asm_bytes(BuildCtx *ctx,uint8_t *p,int n)

{
  ulong uVar1;
  
  if (0 < n) {
    uVar1 = 0;
    do {
      if ((uVar1 & 0xf) == 0) {
        fprintf((FILE *)ctx->fp,"\t.byte %d",(ulong)p[uVar1]);
      }
      else {
        fprintf((FILE *)ctx->fp,",%d",(ulong)p[uVar1]);
        if (((uint)uVar1 & 0xf) == 0xf) {
          putc(10,(FILE *)ctx->fp);
        }
      }
      uVar1 = uVar1 + 1;
    } while ((uint)n != uVar1);
  }
  if ((n & 0xfU) != 0) {
    putc(10,(FILE *)ctx->fp);
    return;
  }
  return;
}

Assistant:

static void emit_asm_bytes(BuildCtx *ctx, uint8_t *p, int n)
{
  int i;
  for (i = 0; i < n; i++) {
    if ((i & 15) == 0)
      fprintf(ctx->fp, "\t.byte %d", p[i]);
    else
      fprintf(ctx->fp, ",%d", p[i]);
    if ((i & 15) == 15) putc('\n', ctx->fp);
  }
  if ((n & 15) != 0) putc('\n', ctx->fp);
}